

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

int __thiscall
google::protobuf::io::FileInputStream::CopyingFileInputStream::Read
          (CopyingFileInputStream *this,void *buffer,int size)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  bool bVar4;
  int result;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  LogMessage *in_stack_ffffffffffffff80;
  undefined1 local_50 [60];
  int local_14;
  void *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  if ((*(byte *)(in_RDI + 0xd) & 1) != 0) {
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff80,(LogLevel_conflict)((ulong)local_50 >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff6c);
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    internal::LogFinisher::operator=
              ((LogFinisher *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    internal::LogMessage::~LogMessage((LogMessage *)0x3e339c);
  }
  do {
    sVar2 = read(*(int *)(in_RDI + 8),local_10,(long)local_14);
    iVar1 = (int)sVar2;
    bVar4 = false;
    if (iVar1 < 0) {
      piVar3 = __errno_location();
      bVar4 = *piVar3 == 4;
    }
  } while (bVar4);
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    *(int *)(in_RDI + 0x10) = *piVar3;
  }
  return iVar1;
}

Assistant:

int FileInputStream::CopyingFileInputStream::Read(void* buffer, int size) {
  GOOGLE_CHECK(!is_closed_);

  int result;
  do {
    result = read(file_, buffer, size);
  } while (result < 0 && errno == EINTR);

  if (result < 0) {
    // Read error (not EOF).
    errno_ = errno;
  }

  return result;
}